

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O0

void Imf_3_3::Attribute::registerAttributeType(char *typeName,_func_Attribute_ptr *newAttribute)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  char *in_RDI;
  stringstream _iex_throw_s;
  lock_guard<std::mutex> lock;
  LockedTypeMap *tMap;
  stringstream *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  value_type *in_stack_fffffffffffffde8;
  LockedTypeMap *this;
  pair<const_char_*const,_Imf_3_3::Attribute_*(*)()> local_1d8;
  stringstream local_1c8 [16];
  ostream local_1b8 [376];
  _Self local_40 [3];
  _Self local_28 [2];
  LockedTypeMap *local_18;
  _func_Attribute_ptr *local_10;
  char *local_8;
  
  local_8 = in_RDI;
  local_18 = anon_unknown_0::typeMap();
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0)
             ,(mutex_type *)in_stack_fffffffffffffdd8);
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_Imf_3_3::Attribute_*(*)(),_Imf_3_3::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>_>
       ::find((map<const_char_*,_Imf_3_3::Attribute_*(*)(),_Imf_3_3::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>_>
               *)in_stack_fffffffffffffdd8,(key_type *)0x8ed852);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_Imf_3_3::Attribute_*(*)(),_Imf_3_3::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>_>
       ::end((map<const_char_*,_Imf_3_3::Attribute_*(*)(),_Imf_3_3::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>_>
              *)in_stack_fffffffffffffdd8);
  bVar1 = std::operator!=(local_28,local_40);
  if (!bVar1) {
    this = local_18;
    std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>::
    pair<const_char_*&,_Imf_3_3::Attribute_*(*&)(),_true>(&local_1d8,&local_8,&local_10);
    std::
    map<const_char_*,_Imf_3_3::Attribute_*(*)(),_Imf_3_3::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>_>
    ::insert(&this->super_TypeMap,in_stack_fffffffffffffde8);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x8ed9eb);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1c8);
  poVar2 = std::operator<<(local_1b8,"Cannot register image file attribute type \"");
  poVar2 = std::operator<<(poVar2,local_8);
  std::operator<<(poVar2,"\". The type has already been registered.");
  uVar3 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc
            ((ArgExc *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8);
  __cxa_throw(uVar3,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
Attribute::registerAttributeType (
    const char typeName[], Attribute* (*newAttribute) ())
{
    LockedTypeMap& tMap = typeMap ();
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (tMap.mutex);
#endif
    if (tMap.find (typeName) != tMap.end ())
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot register image file attribute "
            "type \""
                << typeName
                << "\". "
                   "The type has already been registered.");

    tMap.insert (TypeMap::value_type (typeName, newAttribute));
}